

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O3

bool __thiscall
Clasp::ClaspStatistics::removeStat(ClaspStatistics *this,StatisticObject *obj,bool recurse)

{
  int iVar1;
  uint32 uVar2;
  uint64 in_RAX;
  reference ppIVar3;
  char *k;
  uint32 uVar4;
  StatisticObject local_38;
  
  local_38.handle_ = in_RAX;
  iVar1 = Impl::remove(this->impl_,(char *)obj);
  if (((recurse & SUB41(iVar1,0)) == 1) && (obj->handle_ != 0)) {
    ppIVar3 = bk_lib::
              pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
              ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                    *)StatisticObject::types_s,(uint)(ushort)(obj->handle_ >> 0x30));
    if (((*ppIVar3)->type).val_ == Map) {
      uVar2 = StatisticObject::size(obj);
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          k = StatisticObject::key(obj,uVar4);
          local_38 = StatisticObject::at(obj,k);
          removeStat(this,&local_38,true);
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
    }
    else if (((obj->handle_ != 0) &&
             (ppIVar3 = bk_lib::
                        pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                        ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                              *)StatisticObject::types_s,(uint)(ushort)(obj->handle_ >> 0x30)),
             ((*ppIVar3)->type).val_ == Array)) && (uVar2 = StatisticObject::size(obj), uVar2 != 0))
    {
      uVar4 = 0;
      do {
        local_38 = StatisticObject::operator[](obj,uVar4);
        removeStat(this,&local_38,true);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  return SUB41(iVar1,0);
}

Assistant:

bool ClaspStatistics::removeStat(const StatisticObject& obj, bool recurse) {
	bool ret = impl_->remove(obj);
	if (ret && recurse) {
		if (obj.type() == Potassco::Statistics_t::Map) {
			for (uint32 i = 0, end = obj.size(); i != end; ++i) {
				removeStat(obj.at(obj.key(i)), true);
			}
		}
		else if (obj.type() == Potassco::Statistics_t::Array) {
			for (uint32 i = 0, end = obj.size(); i != end; ++i) {
				removeStat(obj[i], true);
			}
		}
	}
	return ret;
}